

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O1

void __thiscall
Memory::RecyclerSweepManager::AddUnaccountedNewObjectAllocBytes<MediumAllocationBlockAttributes>
          (RecyclerSweepManager *this,SmallHeapBlockT<MediumAllocationBlockAttributes> *heapBlock)

{
  size_t *psVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  
  if (this->recycler->inPartialCollectMode != true) {
    SmallHeapBlockT<MediumAllocationBlockAttributes>::ClearAllAllocBytes(heapBlock);
    return;
  }
  uVar5 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAndClearUnaccountedAllocBytes
                    (heapBlock);
  if ((uVar5 != 0) && (heapBlock->lastUncollectedAllocBytes != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x136,
                       "(heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0)",
                       "heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar2 = 0;
  }
  heapBlock->lastUncollectedAllocBytes = heapBlock->lastUncollectedAllocBytes + uVar5;
  psVar1 = &this->recycler->partialUncollectedAllocBytes;
  *psVar1 = *psVar1 + (ulong)uVar5;
  this->nextPartialUncollectedAllocBytes = this->nextPartialUncollectedAllocBytes + (ulong)uVar5;
  return;
}

Assistant:

void
RecyclerSweepManager::AddUnaccountedNewObjectAllocBytes(SmallHeapBlockT<TBlockAttributes> * heapBlock)
{
#if ENABLE_PARTIAL_GC
    // Only need to update the unaccounted alloc bytes if we are in partial collect mode
    if (recycler->inPartialCollectMode)
    {
        uint unaccountedAllocBytes = heapBlock->GetAndClearUnaccountedAllocBytes();
        Assert(heapBlock->lastUncollectedAllocBytes == 0 || unaccountedAllocBytes == 0);
        DebugOnly(heapBlock->lastUncollectedAllocBytes += unaccountedAllocBytes);
        recycler->partialUncollectedAllocBytes += unaccountedAllocBytes;
        this->nextPartialUncollectedAllocBytes += unaccountedAllocBytes;
    }
    else
#endif
    {
        // We don't care, clear the unaccounted to start tracking for new object for next GC
        heapBlock->ClearAllAllocBytes();
    }
}